

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O1

SAM_hdr * cram_read_SAM_hdr(cram_fd *fd)

{
  uint uVar1;
  uint uVar2;
  hFILE *fp;
  bool bVar3;
  int iVar4;
  int iVar5;
  ulong __n;
  cram_container *c;
  cram_block *pcVar6;
  SAM_hdr *pSVar7;
  void *buffer;
  size_t sVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  size_t sVar13;
  ulong nbytes;
  char *unaff_R15;
  int32_t header_len;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  if ((fd->version & 0xffffff00U) == 0x100) {
    iVar4 = int32_decode(fd,&local_40);
    if (iVar4 == -1) {
      return (SAM_hdr *)0x0;
    }
    nbytes = (ulong)local_40;
    unaff_R15 = (char *)malloc(nbytes + 1);
    if (unaff_R15 == (char *)0x0) {
      return (SAM_hdr *)0x0;
    }
    *unaff_R15 = '\0';
    fp = fd->fp;
    uVar10 = (long)fp->end - (long)fp->begin;
    __n = nbytes;
    if (uVar10 < nbytes) {
      __n = uVar10;
    }
    memcpy(unaff_R15,fp->begin,__n);
    fp->begin = fp->begin + __n;
    if (uVar10 < nbytes) {
      __n = hread2(fp,unaff_R15,nbytes,__n);
    }
    if (__n != nbytes) {
      return (SAM_hdr *)0x0;
    }
    fd->first_container = fd->first_container + nbytes + 4;
    goto LAB_00127d39;
  }
  c = cram_read_container(fd);
  if (c == (cram_container *)0x0) {
LAB_00127d33:
    bVar3 = false;
  }
  else {
    if ((c->num_blocks < 1) || (pcVar6 = cram_read_block(fd), pcVar6 == (cram_block *)0x0)) {
      cram_free_container(c);
      goto LAB_00127d33;
    }
    cram_uncompress_block(pcVar6);
    uVar1 = pcVar6->content_id;
    iVar4 = fd->version;
    unaff_R15 = (char *)0x1;
    local_34 = 1;
    if (((0x7f < uVar1) && (local_34 = 2, 0x3fff < uVar1)) && (local_34 = 3, 0x1fffff < uVar1)) {
      local_34 = 5 - (uint)(uVar1 < 0x10000000);
    }
    uVar1 = pcVar6->comp_size;
    uVar2 = pcVar6->uncomp_size;
    if (((0x7f < uVar2) && (unaff_R15 = (char *)0x2, 0x3fff < uVar2)) &&
       (unaff_R15 = (char *)0x3, 0x1fffff < uVar2)) {
      unaff_R15 = (char *)(ulong)(5 - (uVar2 < 0x10000000));
    }
    local_38 = 1;
    if (((0x7f < uVar1) && (local_38 = 2, 0x3fff < uVar1)) && (local_38 = 3, 0x1fffff < uVar1)) {
      local_38 = 5 - (uint)(uVar1 < 0x10000000);
    }
    iVar5 = int32_get(pcVar6,&local_40);
    if ((iVar5 == -1) || (sVar13 = (size_t)local_40, pcVar6->uncomp_size + -4 < local_40)) {
      cram_free_container(c);
      cram_free_block(pcVar6);
      goto LAB_00127d33;
    }
    local_3c = (int)unaff_R15;
    unaff_R15 = (char *)malloc(sVar13 + 1);
    if (unaff_R15 == (char *)0x0) {
      cram_free_container(c);
      cram_free_block(pcVar6);
      bVar3 = false;
      unaff_R15 = (char *)0x0;
    }
    else {
      iVar4 = uVar1 + 2 + (uint)(0x2ff < iVar4) * 4 + local_34 + local_3c + local_38;
      memcpy(unaff_R15,pcVar6->data + pcVar6->byte,sVar13);
      unaff_R15[sVar13] = '\0';
      cram_free_block(pcVar6);
      if (1 < c->num_blocks) {
        iVar5 = 1;
        do {
          pcVar6 = cram_read_block(fd);
          if (pcVar6 == (cram_block *)0x0) goto LAB_00127f31;
          uVar1 = pcVar6->content_id;
          iVar9 = 1;
          iVar11 = 1;
          if (((0x7f < uVar1) && (iVar11 = 2, 0x3fff < uVar1)) && (iVar11 = 3, 0x1fffff < uVar1)) {
            iVar11 = 5 - (uint)(uVar1 < 0x10000000);
          }
          uVar1 = pcVar6->uncomp_size;
          if (((0x7f < uVar1) && (iVar9 = 2, 0x3fff < uVar1)) && (iVar9 = 3, 0x1fffff < uVar1)) {
            iVar9 = 5 - (uint)(uVar1 < 0x10000000);
          }
          uVar1 = pcVar6->comp_size;
          iVar12 = 1;
          if (((0x7f < uVar1) && (iVar12 = 2, 0x3fff < uVar1)) && (iVar12 = 3, 0x1fffff < uVar1)) {
            iVar12 = 5 - (uint)(uVar1 < 0x10000000);
          }
          iVar4 = iVar4 + uVar1 + iVar11 + iVar9 + (uint)(0x2ff < fd->version) * 4 + iVar12 + 2;
          cram_free_block(pcVar6);
          iVar5 = iVar5 + 1;
        } while (iVar5 < c->num_blocks);
      }
      iVar5 = c->length;
      if ((iVar5 != 0) && (iVar5 - iVar4 != 0 && iVar4 <= iVar5)) {
        sVar13 = (size_t)(iVar5 - iVar4);
        buffer = malloc(sVar13);
        if ((buffer == (void *)0x0) || (sVar8 = hread(fd->fp,buffer,sVar13), sVar8 != sVar13)) {
LAB_00127f31:
          cram_free_container(c);
          bVar3 = false;
          goto LAB_00127d35;
        }
        free(buffer);
      }
      cram_free_container(c);
      bVar3 = true;
    }
  }
LAB_00127d35:
  if (!bVar3) {
    return (SAM_hdr *)0x0;
  }
LAB_00127d39:
  pSVar7 = sam_hdr_parse_(unaff_R15,local_40);
  free(unaff_R15);
  return pSVar7;
}

Assistant:

SAM_hdr *cram_read_SAM_hdr(cram_fd *fd) {
    int32_t header_len;
    char *header;
    SAM_hdr *hdr;

    /* 1.1 onwards stores the header in the first block of a container */
    if (CRAM_MAJOR_VERS(fd->version) == 1) {
	/* Length */
	if (-1 == int32_decode(fd, &header_len))
	    return NULL;

	/* Alloc and read */
	if (NULL == (header = malloc(header_len+1)))
	    return NULL;

	*header = 0;
	if (header_len != hread(fd->fp, header, header_len))
	    return NULL;

	fd->first_container += 4 + header_len;
    } else {
	cram_container *c = cram_read_container(fd);
	cram_block *b;
	int i, len;

	if (!c)
	    return NULL;

	if (c->num_blocks < 1) {
	    cram_free_container(c);
	    return NULL;
	}

	if (!(b = cram_read_block(fd))) {
	    cram_free_container(c);
	    return NULL;
	}
	cram_uncompress_block(b);

	len = b->comp_size + 2 + 4*(CRAM_MAJOR_VERS(fd->version) >= 3) +
	    itf8_size(b->content_id) + 
	    itf8_size(b->uncomp_size) + 
	    itf8_size(b->comp_size);

	/* Extract header from 1st block */
	if (-1 == int32_get(b, &header_len) ||
	    b->uncomp_size - 4 < header_len) {
	    cram_free_container(c);
	    cram_free_block(b);
	    return NULL;
	}
	if (NULL == (header = malloc(header_len+1))) {
	    cram_free_container(c);
	    cram_free_block(b);
	    return NULL;
	}
	memcpy(header, BLOCK_END(b), header_len);
	header[header_len]='\0';
	cram_free_block(b);

	/* Consume any remaining blocks */
	for (i = 1; i < c->num_blocks; i++) {
	    if (!(b = cram_read_block(fd))) {
		cram_free_container(c);
		return NULL;
	    }
	    len += b->comp_size + 2 + 4*(CRAM_MAJOR_VERS(fd->version) >= 3) +
		itf8_size(b->content_id) + 
		itf8_size(b->uncomp_size) + 
		itf8_size(b->comp_size);
	    cram_free_block(b);
	}

	if (c->length && c->length > len) {
	    // Consume padding
	    char *pads = malloc(c->length - len);
	    if (!pads) {
		cram_free_container(c);
		return NULL;
	    }

	    if (c->length - len != hread(fd->fp, pads, c->length - len)) {
		cram_free_container(c);
		return NULL;
	    }
	    free(pads);
	}

	cram_free_container(c);
    }

    /* Parse */
    hdr = sam_hdr_parse_(header, header_len);
    free(header);

    return hdr;
}